

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_multi_test.c
# Opt level: O0

int multi_dec_advanced(MpiDecMultiCtx *data)

{
  int iVar1;
  RK_S64 RVar2;
  MppFrame local_70;
  MppPacket packet_out;
  MppFrame frame_out;
  FileBufSlot *slot;
  long lStack_50;
  RK_U32 quiet;
  MppTask task;
  MppFrame frame;
  MppPacket packet;
  MppApi *mpi;
  MppCtx ctx;
  MpiDecTestCmd *cmd;
  MpiDecMultiCtx *pMStack_18;
  MPP_RET ret;
  MpiDecMultiCtx *data_local;
  
  cmd._4_4_ = 0;
  ctx = data->cmd;
  mpi = (MppApi *)data->ctx;
  packet = data->mpi;
  frame = (MppFrame)0x0;
  task = data->frame;
  lStack_50 = 0;
  slot._4_4_ = data->quiet;
  frame_out = (MppFrame)0x0;
  pMStack_18 = data;
  cmd._4_4_ = reader_index_read(((MpiDecTestCmd *)ctx)->reader,0,(FileBufSlot **)&frame_out);
  if ((cmd._4_4_ != MPP_OK) &&
     (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                 "multi_dec_advanced",0x100), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((frame_out == (MppFrame)0x0) &&
     (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"slot",
                 "multi_dec_advanced",0x101), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  mpp_packet_init_with_buffer(&frame,*(undefined8 *)((long)frame_out + 8));
  if (*(int *)((long)frame_out + 0x18) != 0) {
    mpp_packet_set_eos(frame);
  }
  cmd._4_4_ = (**(code **)((long)packet + 0x50))(mpi,0,0xffffffff);
  if (cmd._4_4_ == 0) {
    cmd._4_4_ = (**(code **)((long)packet + 0x58))(mpi,0,&stack0xffffffffffffffb0);
    if (cmd._4_4_ == 0) {
      if ((lStack_50 == 0) &&
         (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task",
                     "multi_dec_advanced",0x115), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      mpp_task_meta_set_packet(lStack_50,0x69706b74,frame);
      mpp_task_meta_set_frame(lStack_50,0x6f66726d,task);
      cmd._4_4_ = (**(code **)((long)packet + 0x60))(mpi,0,lStack_50);
      if (cmd._4_4_ == 0) {
        if (pMStack_18->first_pkt == 0) {
          RVar2 = mpp_time();
          pMStack_18->first_pkt = RVar2;
        }
        cmd._4_4_ = (**(code **)((long)packet + 0x50))(mpi,1,0xffffffff);
        if (cmd._4_4_ == 0) {
          cmd._4_4_ = (**(code **)((long)packet + 0x58))(mpi,1,&stack0xffffffffffffffb0);
          if (cmd._4_4_ == 0) {
            if ((lStack_50 == 0) &&
               (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task",
                           "multi_dec_advanced",0x130), (_mpp_debug & 0x10000000) != 0)) {
              abort();
            }
            if (lStack_50 != 0) {
              packet_out = (MppPacket)0x0;
              mpp_task_meta_get_frame(lStack_50,0x6f66726d,&packet_out);
              if (task != (MppTask)0x0) {
                if (pMStack_18->first_frm == 0) {
                  RVar2 = mpp_time();
                  pMStack_18->first_frm = RVar2;
                }
                if (pMStack_18->fp_output != (FILE *)0x0) {
                  dump_mpp_frame_to_file(task,pMStack_18->fp_output);
                }
                if (slot._4_4_ == 0) {
                  _mpp_log_l(4,"mpi_dec_multi_test","%p decoded frame %d\n",0,mpi,
                             pMStack_18->frame_count);
                }
                pMStack_18->frame_count = pMStack_18->frame_count + 1;
                iVar1 = mpp_frame_get_eos(packet_out);
                if ((iVar1 != 0) && (slot._4_4_ == 0)) {
                  _mpp_log_l(4,"mpi_dec_multi_test","%p found eos frame\n",0,mpi);
                }
                fps_calc_inc(*(FpsCalc *)((long)ctx + 0x248));
              }
              if (pMStack_18->frame_num < 1) {
                if ((pMStack_18->frame_num == 0) && (*(int *)((long)frame_out + 0x18) != 0)) {
                  pMStack_18->loop_end = 1;
                }
              }
              else if (pMStack_18->frame_num <= pMStack_18->frame_count) {
                pMStack_18->loop_end = 1;
              }
              cmd._4_4_ = (**(code **)((long)packet + 0x60))(mpi,1,lStack_50);
              if (cmd._4_4_ != 0) {
                _mpp_log_l(2,"mpi_dec_multi_test","mpp task output enqueue failed\n",0);
              }
            }
            cmd._4_4_ = (**(code **)((long)packet + 0x58))(mpi,0,&stack0xffffffffffffffb0);
            if (cmd._4_4_ == 0) {
              if ((lStack_50 == 0) &&
                 (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task",
                             "multi_dec_advanced",0x163), (_mpp_debug & 0x10000000) != 0)) {
                abort();
              }
              if (lStack_50 != 0) {
                local_70 = (MppFrame)0x0;
                mpp_task_meta_get_packet(lStack_50,0x69706b74,&local_70);
                if ((local_70 == (MppFrame)0x0) || (local_70 != frame)) {
                  _mpp_log_l(2,"mpi_dec_multi_test","mismatch packet %p -> %p\n",
                             "multi_dec_advanced",frame,local_70);
                }
                mpp_packet_deinit(&local_70);
                cmd._4_4_ = (**(code **)((long)packet + 0x60))(mpi,0,lStack_50);
                if (cmd._4_4_ != 0) {
                  _mpp_log_l(2,"mpi_dec_multi_test","%p mpp task input enqueue failed\n",0,mpi);
                }
              }
              data_local._4_4_ = cmd._4_4_;
            }
            else {
              _mpp_log_l(2,"mpi_dec_multi_test","%p mpp task input dequeue failed\n",0,mpi);
              data_local._4_4_ = cmd._4_4_;
            }
          }
          else {
            _mpp_log_l(2,"mpi_dec_multi_test","mpp task output dequeue failed\n",0);
            data_local._4_4_ = cmd._4_4_;
          }
        }
        else {
          _mpp_log_l(2,"mpi_dec_multi_test","mpp output poll failed\n",0);
          data_local._4_4_ = cmd._4_4_;
        }
      }
      else {
        _mpp_log_l(2,"mpi_dec_multi_test","mpp task input enqueue failed\n",0);
        data_local._4_4_ = cmd._4_4_;
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_multi_test","mpp task input dequeue failed\n",0);
      data_local._4_4_ = cmd._4_4_;
    }
  }
  else {
    _mpp_log_l(2,"mpi_dec_multi_test","mpp input poll failed\n",0);
    data_local._4_4_ = cmd._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static int multi_dec_advanced(MpiDecMultiCtx *data)
{
    MPP_RET ret = MPP_OK;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    MppPacket packet = NULL;
    MppFrame  frame  = data->frame;
    MppTask task = NULL;
    RK_U32 quiet = data->quiet;
    FileBufSlot *slot = NULL;

    ret = reader_index_read(cmd->reader, 0, &slot);
    mpp_assert(ret == MPP_OK);
    mpp_assert(slot);

    mpp_packet_init_with_buffer(&packet, slot->buf);

    // setup eos flag
    if (slot->eos)
        mpp_packet_set_eos(packet);

    ret = mpi->poll(ctx, MPP_PORT_INPUT, MPP_POLL_BLOCK);
    if (ret) {
        mpp_err("mpp input poll failed\n");
        return ret;
    }

    ret = mpi->dequeue(ctx, MPP_PORT_INPUT, &task);  /* input queue */
    if (ret) {
        mpp_err("mpp task input dequeue failed\n");
        return ret;
    }

    mpp_assert(task);

    mpp_task_meta_set_packet(task, KEY_INPUT_PACKET, packet);
    mpp_task_meta_set_frame (task, KEY_OUTPUT_FRAME,  frame);

    ret = mpi->enqueue(ctx, MPP_PORT_INPUT, task);  /* input queue */
    if (ret) {
        mpp_err("mpp task input enqueue failed\n");
        return ret;
    }

    if (!data->first_pkt)
        data->first_pkt = mpp_time();

    /* poll and wait here */
    ret = mpi->poll(ctx, MPP_PORT_OUTPUT, MPP_POLL_BLOCK);
    if (ret) {
        mpp_err("mpp output poll failed\n");
        return ret;
    }

    ret = mpi->dequeue(ctx, MPP_PORT_OUTPUT, &task); /* output queue */
    if (ret) {
        mpp_err("mpp task output dequeue failed\n");
        return ret;
    }

    mpp_assert(task);

    if (task) {
        MppFrame frame_out = NULL;

        mpp_task_meta_get_frame(task, KEY_OUTPUT_FRAME, &frame_out);

        if (frame) {
            if (!data->first_frm)
                data->first_frm = mpp_time();

            if (data->fp_output)
                dump_mpp_frame_to_file(frame, data->fp_output);

            mpp_log_q(quiet, "%p decoded frame %d\n", ctx, data->frame_count);
            data->frame_count++;

            if (mpp_frame_get_eos(frame_out)) {
                mpp_log_q(quiet, "%p found eos frame\n", ctx);
            }
            fps_calc_inc(cmd->fps);
        }

        if (data->frame_num > 0) {
            if (data->frame_count >= data->frame_num)
                data->loop_end = 1;
        } else if (data->frame_num == 0) {
            if (slot->eos)
                data->loop_end = 1;
        }

        /* output queue */
        ret = mpi->enqueue(ctx, MPP_PORT_OUTPUT, task);
        if (ret)
            mpp_err("mpp task output enqueue failed\n");
    }

    /*
     * The following input port task dequeue and enqueue is to make sure that
     * the input packet can be released. We can directly deinit the input packet
     * after frame output in most cases.
     */
    if (0) {
        mpp_packet_deinit(&packet);
    } else {
        ret = mpi->dequeue(ctx, MPP_PORT_INPUT, &task);  /* input queue */
        if (ret) {
            mpp_err("%p mpp task input dequeue failed\n", ctx);
            return ret;
        }

        mpp_assert(task);
        if (task) {
            MppPacket packet_out = NULL;

            mpp_task_meta_get_packet(task, KEY_INPUT_PACKET, &packet_out);

            if (!packet_out || packet_out != packet)
                mpp_err_f("mismatch packet %p -> %p\n", packet, packet_out);

            mpp_packet_deinit(&packet_out);

            /* input empty task back to mpp to maintain task status */
            ret = mpi->enqueue(ctx, MPP_PORT_INPUT, task);
            if (ret)
                mpp_err("%p mpp task input enqueue failed\n", ctx);
        }
    }

    return ret;
}